

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_rule.c
# Opt level: O2

int equal_fare_rule(fare_rule_t *a,fare_rule_t *b)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = strcmp(a->fare_id,b->fare_id);
  uVar2 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->route_id,b->route_id);
    if (iVar1 == 0) {
      iVar1 = strcmp(a->origin_id,b->origin_id);
      if (iVar1 == 0) {
        iVar1 = strcmp(a->destination_id,b->destination_id);
        uVar2 = 0;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->contains_id,b->contains_id);
          uVar2 = (uint)(iVar1 == 0);
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int equal_fare_rule(const fare_rule_t *a, const fare_rule_t *b) {
    return (!strcmp(a->fare_id, b->fare_id) &&
             !strcmp(a->route_id, b->route_id) &&
             !strcmp(a->origin_id, b->origin_id) &&
             !strcmp(a->destination_id, b->destination_id) &&
             !strcmp(a->contains_id, b->contains_id));
}